

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<true,_false,_false>::fix_
          (DaTrie<true,_false,_false> *this,uint32_t node_pos,
          vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks)

{
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *in_RDX;
  uint in_ESI;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  DaTrie<true,_false,_false> *unaff_retaddr;
  uint32_t prev;
  uint32_t next;
  uint32_t block_pos;
  uint32_t in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar7;
  uint32_t in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  uVar2 = in_ESI >> 8;
  while (uVar3 = num_blocks((DaTrie<true,_false,_false> *)0x16e4e1), uVar3 <= uVar2) {
    push_block_(unaff_retaddr);
  }
  sVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::size(in_RDI);
  if (sVar4 <= in_ESI) {
    __assert_fail("node_pos < bc_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x434,
                  "void ddd::DaTrie<true, false, false>::fix_(uint32_t, std::vector<BlockLink> &) [WithBLM = true, WithNLM = false, Prefix = false]"
                 );
  }
  pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)in_ESI);
  bVar1 = Bc::is_fixed(pvVar5);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    *(int *)((long)&in_RDI[4].super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                    super__Vector_impl_data._M_start + 4) =
         *(int *)((long)&in_RDI[4].super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                         super__Vector_impl_data._M_start + 4) + -1;
    pvVar6 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                       (in_RDX,(ulong)uVar2);
    pvVar6->num_emps = pvVar6->num_emps - 1;
    pvVar6 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                       (in_RDX,(ulong)uVar2);
    if (pvVar6->num_emps == 0) {
      delete_block_link_((DaTrie<true,_false,_false> *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),
                         in_stack_ffffffffffffffdc,
                         (vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)in_RDI);
    }
    else {
      uVar3 = next_((DaTrie<true,_false,_false> *)
                    CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    in_stack_ffffffffffffffbc);
      prev_((DaTrie<true,_false,_false> *)
            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc)
      ;
      set_next_((DaTrie<true,_false,_false> *)
                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      set_prev_((DaTrie<true,_false,_false> *)
                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      uVar7 = in_ESI;
      pvVar6 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                         (in_RDX,(ulong)uVar2);
      if (uVar7 == pvVar6->head) {
        pvVar6 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                           (in_RDX,(ulong)uVar2);
        pvVar6->head = uVar3;
      }
    }
    pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)in_ESI);
    Bc::fix(pvVar5);
    return;
  }
  __assert_fail("!bc_[node_pos].is_fixed()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                ,0x435,
                "void ddd::DaTrie<true, false, false>::fix_(uint32_t, std::vector<BlockLink> &) [WithBLM = true, WithNLM = false, Prefix = false]"
               );
}

Assistant:

void fix_(uint32_t node_pos, std::vector<BlockLink>& blocks) {
    auto block_pos = node_pos / BLOCK_SIZE;
    while (num_blocks() <= block_pos) {
      push_block_();
    }

    assert(node_pos < bc_.size());
    assert(!bc_[node_pos].is_fixed());

    --bc_emps_;
    --blocks[block_pos].num_emps;

    if (blocks[block_pos].num_emps == 0) {
      delete_block_link_(block_pos, blocks_);
    } else {
      auto next = next_(node_pos);
      auto prev = prev_(node_pos);
      set_next_(prev, next);
      set_prev_(next, prev);
      if (node_pos == blocks[block_pos].head) {
        blocks[block_pos].head = next;
      }
    }
    bc_[node_pos].fix();
  }